

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void __thiscall
Js::JavascriptStackWalker::SetCurrentArgumentsObject(JavascriptStackWalker *this,Var args)

{
  Var args_local;
  JavascriptStackWalker *this_local;
  
  if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
    if ((*(ushort *)&this->field_0x50 & 1) == 0) {
      SetCurrentNativeArgumentsObject(this,args);
    }
    else {
      InlinedFrameWalker::SetArgumentsObject(&this->inlinedFrameWalker,args);
    }
  }
  else {
    InterpreterStackFrame::SetArgumentsObject(this->interpreterFrame,args);
  }
  return;
}

Assistant:

void JavascriptStackWalker::SetCurrentArgumentsObject(Var args)
    {
#if ENABLE_NATIVE_CODEGEN
        if (interpreterFrame)
#else
        Assert(interpreterFrame);
#endif
        {
            interpreterFrame->SetArgumentsObject(args);
        }
#if ENABLE_NATIVE_CODEGEN
        else
        {
            if (inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.SetArgumentsObject(args);
            }
            else
            {
                this->SetCurrentNativeArgumentsObject(args);
            }
        }
#endif
    }